

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::Matcher::MatchBOILiteral2
          (Matcher *this,Char *input,CharCount inputLength,CharCount offset,DWORD literal2)

{
  GroupInfo *pGVar1;
  bool bVar2;
  
  if ((inputLength < 2 || offset != 0) ||
     ((((this->program).ptr)->rep).boiLiteral2.literal != *(Type *)input)) {
    bVar2 = false;
    ResetGroup(this,0);
  }
  else {
    pGVar1 = GroupIdToGroupInfo(this,0);
    pGVar1->offset = 0;
    pGVar1->length = 2;
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

inline bool Matcher::MatchBOILiteral2(const Char* const input, const CharCount inputLength, CharCount offset, DWORD literal2)
    {
        if (offset == 0 && inputLength >= 2)
        {
            CompileAssert(sizeof(Char) == 2);
            const Program * program = this->program;
            if (program->rep.boiLiteral2.literal == *(DWORD *)input)
            {
                GroupInfo* const info = GroupIdToGroupInfo(0);
                info->offset = 0;
                info->length = 2;
                return true;
            }
        }
        ResetGroup(0);
        return false;
    }